

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> __thiscall
wallet::SQLiteBatch::GetNewPrefixCursor(SQLiteBatch *this,Span<const_std::byte> prefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  wallet *pwVar2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  bool bVar5;
  int iVar6;
  pointer pbVar7;
  undefined1 auVar8 [8];
  runtime_error *this_00;
  long in_RCX;
  _func_int **args;
  byte *__first;
  char *pcVar9;
  string *in_R9;
  long in_FS_OFFSET;
  Span<const_std::byte> blob;
  Span<const_std::byte> blob_00;
  __single_object cursor;
  vector<std::byte,_std::allocator<std::byte>_> end_range;
  vector<std::byte,_std::allocator<std::byte>_> start_range;
  undefined8 local_98;
  undefined1 local_90 [8];
  pointer local_88;
  pointer local_80;
  long local_78;
  vector<std::byte,_std::allocator<std::byte>_> local_70;
  string local_58;
  long local_38;
  
  __first = (byte *)prefix.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(undefined8 *)(prefix.m_data + 8) + 200) == 0) {
    (this->super_DatabaseBatch)._vptr_DatabaseBatch = (_func_int **)0x0;
  }
  else {
    std::vector<std::byte,std::allocator<std::byte>>::vector<std::byte_const*,void>
              ((vector<std::byte,std::allocator<std::byte>> *)&local_70,__first,__first + in_RCX,
               (allocator_type *)&local_58);
    std::vector<std::byte,std::allocator<std::byte>>::vector<std::byte_const*,void>
              ((vector<std::byte,std::allocator<std::byte>> *)&local_88,__first,__first + in_RCX,
               (allocator_type *)&local_58);
    pbVar7 = local_80;
    while (pbVar7 != local_88) {
      if (pbVar7[-1] != 0xff) {
        pbVar7[-1] = pbVar7[-1] + 1;
        break;
      }
      pbVar7 = pbVar7 + -1;
      *pbVar7 = 0;
    }
    if ((pbVar7 == local_88) && (local_80 != local_88)) {
      local_80 = local_88;
    }
    std::
    make_unique<wallet::SQLiteCursor,std::vector<std::byte,std::allocator<std::byte>>&,std::vector<std::byte,std::allocator<std::byte>>&>
              ((vector<std::byte,_std::allocator<std::byte>_> *)local_90,&local_70);
    if (local_90 == (undefined1  [8])0x0) {
LAB_00c8ff7a:
      (this->super_DatabaseBatch)._vptr_DatabaseBatch = (_func_int **)0x0;
      auVar8 = (undefined1  [8])0x0;
    }
    else {
      pcVar9 = "SELECT key, value FROM main WHERE key >= ? AND key < ?";
      if (local_88 == local_80) {
        pcVar9 = "SELECT key, value FROM main WHERE key >= ?";
      }
      args = (_func_int **)((long)local_90 + 8);
      iVar6 = sqlite3_prepare_v2(*(undefined8 *)(*(undefined8 *)(prefix.m_data + 8) + 200),pcVar9,
                                 0xffffffff,args,0);
      if (iVar6 != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_98 = sqlite3_errstr(iVar6);
        tinyformat::format<char_const*>
                  (&local_58,
                   (tinyformat *)"SQLiteDatabase: Failed to setup cursor SQL statement: %s\n",
                   (char *)&local_98,(char **)args);
        std::runtime_error::runtime_error(this_00,(string *)&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00c90138;
      }
      pwVar2 = *(wallet **)((long)local_90 + 8);
      p_Var3 = *(_func_int **)((long)local_90 + 0x10);
      p_Var4 = *(_func_int **)((long)local_90 + 0x18);
      paVar1 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"prefix_start","");
      blob.m_size = (size_t)&local_58;
      blob.m_data = (byte *)(p_Var4 + -(long)p_Var3);
      bVar5 = BindBlobToStatement(pwVar2,(sqlite3_stmt *)0x1,(int)p_Var3,blob,in_R9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (!bVar5) goto LAB_00c8ff7a;
      if (local_88 != local_80) {
        pwVar2 = *(wallet **)((long)local_90 + 8);
        p_Var3 = *(_func_int **)((long)local_90 + 0x28);
        p_Var4 = *(_func_int **)((long)local_90 + 0x30);
        local_58._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"prefix_end","");
        blob_00.m_size = (size_t)&local_58;
        blob_00.m_data = (byte *)(p_Var4 + -(long)p_Var3);
        bVar5 = BindBlobToStatement(pwVar2,(sqlite3_stmt *)0x2,(int)p_Var3,blob_00,in_R9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if (!bVar5) goto LAB_00c8ff7a;
      }
      auVar8 = local_90;
      local_90 = (undefined1  [8])0x0;
    }
    (this->super_DatabaseBatch)._vptr_DatabaseBatch = (_func_int **)auVar8;
    if (local_90 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_90 + 8))();
    }
    if (local_88 != (pointer)0x0) {
      operator_delete(local_88,local_78 - (long)local_88);
    }
    if (local_70.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>,_true,_true>
            )(__uniq_ptr_data<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>,_true,_true>
              )this;
  }
LAB_00c90138:
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DatabaseCursor> SQLiteBatch::GetNewPrefixCursor(Span<const std::byte> prefix)
{
    if (!m_database.m_db) return nullptr;

    // To get just the records we want, the SQL statement does a comparison of the binary data
    // where the data must be greater than or equal to the prefix, and less than
    // the prefix incremented by one (when interpreted as an integer)
    std::vector<std::byte> start_range(prefix.begin(), prefix.end());
    std::vector<std::byte> end_range(prefix.begin(), prefix.end());
    auto it = end_range.rbegin();
    for (; it != end_range.rend(); ++it) {
        if (*it == std::byte(std::numeric_limits<unsigned char>::max())) {
            *it = std::byte(0);
            continue;
        }
        *it = std::byte(std::to_integer<unsigned char>(*it) + 1);
        break;
    }
    if (it == end_range.rend()) {
        // If the prefix is all 0xff bytes, clear end_range as we won't need it
        end_range.clear();
    }

    auto cursor = std::make_unique<SQLiteCursor>(start_range, end_range);
    if (!cursor) return nullptr;

    const char* stmt_text = end_range.empty() ? "SELECT key, value FROM main WHERE key >= ?" :
                            "SELECT key, value FROM main WHERE key >= ? AND key < ?";
    int res = sqlite3_prepare_v2(m_database.m_db, stmt_text, -1, &cursor->m_cursor_stmt, nullptr);
    if (res != SQLITE_OK) {
        throw std::runtime_error(strprintf(
            "SQLiteDatabase: Failed to setup cursor SQL statement: %s\n", sqlite3_errstr(res)));
    }

    if (!BindBlobToStatement(cursor->m_cursor_stmt, 1, cursor->m_prefix_range_start, "prefix_start")) return nullptr;
    if (!end_range.empty()) {
        if (!BindBlobToStatement(cursor->m_cursor_stmt, 2, cursor->m_prefix_range_end, "prefix_end")) return nullptr;
    }

    return cursor;
}